

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm-functions.cpp
# Opt level: O1

size_t arangodb::velocypack::anon_unknown_0::JSONSkipWhiteSpaceC(uint8_t *src,size_t limit)

{
  byte *pbVar1;
  
  pbVar1 = src + limit;
  if (0 < (long)limit) {
    do {
      if ((0x20 < (ulong)*src) || ((0x100002600U >> ((ulong)*src & 0x3f) & 1) == 0)) break;
      src = src + 1;
    } while (src < pbVar1);
  }
  return (size_t)(src + (limit - (long)pbVar1));
}

Assistant:

inline std::size_t JSONSkipWhiteSpaceC(uint8_t const* src, std::size_t limit) {
  // Skip up to limit uint8_t from src as long as they are whitespace.
  // Advance ptr and return the number of skipped bytes.
  uint8_t const* end = src + limit;
  while (src < end &&
         (*src == ' ' || *src == '\t' || *src == '\n' || *src == '\r')) {
    src++;
  }
  return limit - (end - src);
}